

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-surface.c
# Opt level: O0

_Bool plutovg_surface_write_to_jpg(plutovg_surface_t *surface,char *filename,int quality)

{
  int iVar1;
  int success;
  int quality_local;
  char *filename_local;
  plutovg_surface_t *surface_local;
  
  plutovg_surface_write_begin(surface);
  iVar1 = stbi_write_jpg(filename,surface->width,surface->height,4,surface->data,quality);
  plutovg_surface_write_end(surface);
  return iVar1 != 0;
}

Assistant:

bool plutovg_surface_write_to_jpg(const plutovg_surface_t* surface, const char* filename, int quality)
{
    plutovg_surface_write_begin(surface);
    int success = stbi_write_jpg(filename, surface->width, surface->height, 4, surface->data, quality);
    plutovg_surface_write_end(surface);
    return success;
}